

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O0

int fct_snprintf(char *buffer,size_t buffer_len,char *format,...)

{
  int iVar1;
  char *in_RCX;
  va_list args;
  int count;
  __va_list_tag *in_stack_ffffffffffffff18;
  char *in_stack_ffffffffffffff20;
  size_t in_stack_ffffffffffffff28;
  
  iVar1 = fct_vsnprintf(in_RCX,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                        in_stack_ffffffffffffff18);
  return iVar1;
}

Assistant:

static int
fct_snprintf(char *buffer, size_t buffer_len, char const *format, ...)
{
    int count =0;
    va_list args;
    va_start(args, format);
    count =fct_vsnprintf(buffer, buffer_len, format, args);
    va_end(args);
    return count;
}